

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Widget.H
# Opt level: O3

void __thiscall Fl_Window::fullscreen(Fl_Window *this)

{
  byte *pbVar1;
  uint uVar2;
  int iVar3;
  Window WVar4;
  
  no_fullscreen_x = (this->super_Fl_Group).super_Fl_Widget.x_;
  no_fullscreen_y = (this->super_Fl_Group).super_Fl_Widget.y_;
  no_fullscreen_w = (this->super_Fl_Group).super_Fl_Widget.w_;
  no_fullscreen_h = (this->super_Fl_Group).super_Fl_Widget.h_;
  uVar2 = (this->super_Fl_Group).super_Fl_Widget.flags_;
  if ((uVar2 >> 0x12 & 1) != 0 || this->i == (Fl_X *)0x0) {
    (this->super_Fl_Group).super_Fl_Widget.flags_ = uVar2 | 0x40000;
    return;
  }
  iVar3 = Fl_X::ewmh_supported();
  if (iVar3 != 0) {
    if ((fullscreen_screen_top | fullscreen_screen_bottom | fullscreen_screen_left |
        fullscreen_screen_right) < 0) {
      Fl::screen_num((this->super_Fl_Group).super_Fl_Widget.x_,
                     (this->super_Fl_Group).super_Fl_Widget.y_,
                     (this->super_Fl_Group).super_Fl_Widget.w_,
                     (this->super_Fl_Group).super_Fl_Widget.h_);
    }
    WVar4 = 0;
    XSendEvent(fl_display,
               *(undefined8 *)(*(long *)(fl_display + 0xe8) + 0x10 + (long)fl_screen * 0x80),0,
               0x180000);
    if (this->i != (Fl_X *)0x0) {
      WVar4 = this->i->xid;
    }
    send_wm_state_event(WVar4,1,fl_NET_WM_STATE_FULLSCREEN);
    return;
  }
  pbVar1 = (byte *)((long)&(this->super_Fl_Group).super_Fl_Widget.flags_ + 2);
  *pbVar1 = *pbVar1 | 4;
  (*(this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[6])(this);
  (*(this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[5])(this);
  if (this->i == (Fl_X *)0x0) {
    WVar4 = 0;
  }
  else {
    WVar4 = this->i->xid;
  }
  XGrabKeyboard(fl_display,WVar4,1,1,1,fl_event_time);
  Fl::handle(0x19,this);
  return;
}

Assistant:

int x() const {return x_;}